

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  pointer *pppVar1;
  iterator __position;
  int iVar2;
  ShutdownData *this;
  pair<void_(*)(const_void_*),_const_void_*> local_30;
  
  this = ShutdownData::get();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    __position._M_current =
         (this->functions).
         super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_30.first = f;
    local_30.second = arg;
    if (__position._M_current ==
        (this->functions).
        super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
      ::_M_realloc_insert<std::pair<void(*)(void_const*),void_const*>>
                ((vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>
                  *)this,__position,&local_30);
    }
    else {
      (__position._M_current)->first = f;
      (__position._M_current)->second = arg;
      pppVar1 = &(this->functions).
                 super__Vector_base<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}